

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void thread_main(void *arg)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t req;
  char buf [4096];
  long local_1200;
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [88];
  long local_1190;
  undefined1 local_1028 [4096];
  
  local_11f8 = uv_buf_init(local_1028,0x1000);
  uv_barrier_wait(arg);
  uv_sleep(100);
  do {
    do {
      iVar2 = uv_fs_read(0,local_11e8,*(undefined4 *)((long)arg + 0x20),local_11f8,1,
                         0xffffffffffffffff,0);
      lVar1 = local_1190;
      uv_fs_req_cleanup();
    } while (0 < lVar1);
  } while ((lVar1 == -1) && (iVar2 == -4));
  local_1200 = lVar1;
  if (lVar1 == 0) {
    return;
  }
  plVar3 = &local_1200;
  thread_main_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(plVar3,0);
  return;
}

Assistant:

static void thread_main(void* arg) {
  const struct thread_ctx* ctx;
  int size;
  char* data;

  ctx = (struct thread_ctx*)arg;
  size = ctx->size;
  data = ctx->data;

  while (size > 0) {
    ssize_t result;
    int nbytes;
    nbytes = size < ctx->interval ? size : ctx->interval;
    if (ctx->doread) {
      result = write(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors) */
      ASSERT_EQ(result, nbytes);
    } else {
      result = read(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors),
       * but might get a partial read if we are faster than the writer
       */
      ASSERT(result > 0 && result <= nbytes);
    }

    pthread_kill(ctx->pid, SIGUSR1);
    size -= result;
    data += result;
  }
}